

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

int cfl_pick_plane_parameter
              (AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,int cfl_search_range)

{
  BLOCK_SIZE plane_bsize;
  int iVar1;
  MB_MODE_INFO *pMVar2;
  uint cfl_idx;
  bool bVar3;
  int8_t iVar4;
  uint8_t uVar5;
  uint uVar6;
  bool bVar7;
  int64_t iVar8;
  int64_t iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  
  uVar11 = 0x10;
  if (cfl_search_range != 0x21) {
    pMVar2 = *(x->e_mbd).mi;
    plane_bsize = av1_ss_size_lookup[pMVar2->bsize][(x->e_mbd).plane[(uint)plane].subsampling_x]
                  [(x->e_mbd).plane[(uint)plane].subsampling_y];
    iVar4 = pMVar2->cfl_alpha_signs;
    uVar5 = pMVar2->cfl_alpha_idx;
    pMVar2->cfl_alpha_signs = ((char)plane != '\x01') * '\x02';
    pMVar2->cfl_alpha_idx = '\0';
    lVar13 = 0;
    iVar8 = intra_model_rd(&cpi->common,x,plane,plane_bsize,tx_size,0);
    pMVar2->cfl_alpha_signs = iVar4;
    pMVar2->cfl_alpha_idx = uVar5;
    uVar11 = 0x10;
    bVar7 = true;
    do {
      bVar3 = bVar7;
      iVar1 = cfl_dir_ls[lVar13];
      if (0xffffffde < iVar1 - 0x11U) {
        iVar12 = 1;
        iVar10 = 0x20;
        uVar6 = iVar1 + 0x10;
        do {
          cfl_idx = uVar6;
          iVar9 = cfl_compute_rd(cpi,x,plane,tx_size,plane_bsize,cfl_idx,1,(RD_STATS *)0x0);
          if (iVar8 <= iVar9) break;
          iVar10 = iVar10 + -1;
          iVar8 = iVar9;
          if (iVar10 == 0) {
            uVar11 = iVar12 * iVar1 + 0x10;
            break;
          }
          iVar12 = iVar12 + 1;
          uVar11 = cfl_idx;
          uVar6 = iVar1 + cfl_idx;
        } while (iVar1 + cfl_idx < 0x21);
      }
      lVar13 = 1;
      bVar7 = false;
    } while (bVar3);
  }
  return uVar11;
}

Assistant:

static int cfl_pick_plane_parameter(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    int plane, TX_SIZE tx_size,
                                    int cfl_search_range) {
  assert(cfl_search_range >= 1 && cfl_search_range <= CFL_MAGS_SIZE);

  if (cfl_search_range == CFL_MAGS_SIZE) return CFL_INDEX_ZERO;

  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->uv_mode == UV_CFL_PRED);
  const MACROBLOCKD_PLANE *pd = &xd->plane[plane];
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);

  int est_best_cfl_idx = CFL_INDEX_ZERO;
  int fast_mode = 1;
  int start_cfl_idx = CFL_INDEX_ZERO;
  int64_t best_cfl_cost = cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize,
                                         start_cfl_idx, fast_mode, NULL);
  for (int si = 0; si < 2; ++si) {
    const int dir = cfl_dir_ls[si];
    for (int i = 1; i < CFL_MAGS_SIZE; ++i) {
      int cfl_idx = start_cfl_idx + dir * i;
      if (cfl_idx < 0 || cfl_idx >= CFL_MAGS_SIZE) break;
      int64_t cfl_cost = cfl_compute_rd(cpi, x, plane, tx_size, plane_bsize,
                                        cfl_idx, fast_mode, NULL);
      if (cfl_cost < best_cfl_cost) {
        best_cfl_cost = cfl_cost;
        est_best_cfl_idx = cfl_idx;
      } else {
        break;
      }
    }
  }
  return est_best_cfl_idx;
}